

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

uint32_t __thiscall spvtools::opt::Operand::AsId(Operand *this)

{
  uint **ppuVar1;
  uint __line;
  bool bVar2;
  size_t sVar3;
  uint **ppuVar4;
  char *__assertion;
  
  bVar2 = spvIsIdType(this->type);
  if (bVar2) {
    sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&this->words);
    if (sVar3 == 1) {
      ppuVar1 = (uint **)(this->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar4 = &(this->words).small_data_;
      if (ppuVar1 != (uint **)0x0) {
        ppuVar4 = ppuVar1;
      }
      return **ppuVar4;
    }
    __assertion = "words.size() == 1";
    __line = 0x61;
  }
  else {
    __assertion = "spvIsIdType(type)";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,__line,"uint32_t spvtools::opt::Operand::AsId() const");
}

Assistant:

uint32_t AsId() const {
    assert(spvIsIdType(type));
    assert(words.size() == 1);
    return words[0];
  }